

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_impl.cpp
# Opt level: O0

MPP_RET mpp_ops_dec_put_pkt(MppDump info,MppPacket pkt)

{
  uint uVar1;
  size_t sVar2;
  void *__ptr;
  undefined1 local_40 [8];
  AutoMutex auto_lock;
  RK_U32 length;
  MppDumpImpl *p;
  MppPacket pkt_local;
  MppDump info_local;
  
  if (((info != (MppDump)0x0) && (pkt != (MppPacket)0x0)) && (*(long *)((long)info + 0x28) != 0)) {
    sVar2 = mpp_packet_get_length(pkt);
    auto_lock.mLock._4_4_ = (uint)sVar2;
    Mutex::Autolock::Autolock((Autolock *)local_40,*info,1);
    if (*(long *)((long)info + 0x28) != 0) {
      __ptr = mpp_packet_get_data(pkt);
      fwrite(__ptr,1,(ulong)auto_lock.mLock._4_4_,*(FILE **)((long)info + 0x28));
      fflush(*(FILE **)((long)info + 0x28));
    }
    if (*(long *)((long)info + 0x38) != 0) {
      uVar1 = *(uint *)((long)info + 0x58);
      *(uint *)((long)info + 0x58) = uVar1 + 1;
      _ops_log(*(FILE **)((long)info + 0x38),"%d,%s,%d,%d\n",(ulong)uVar1,"pkt",
               (ulong)*(uint *)((long)info + 0x48),(ulong)auto_lock.mLock._4_4_);
      *(uint *)((long)info + 0x48) = auto_lock.mLock._4_4_ + *(int *)((long)info + 0x48);
    }
    Mutex::Autolock::~Autolock((Autolock *)local_40);
  }
  return MPP_OK;
}

Assistant:

MPP_RET mpp_ops_dec_put_pkt(MppDump info, MppPacket pkt)
{
    MppDumpImpl *p = (MppDumpImpl *)info;
    if (NULL == p || NULL == pkt || NULL == p->fp_in)
        return MPP_OK;

    RK_U32 length = mpp_packet_get_length(pkt);
    AutoMutex auto_lock(p->lock);

    if (p->fp_in) {
        fwrite(mpp_packet_get_data(pkt), 1, length, p->fp_in);
        fflush(p->fp_in);
    }

    if (p->fp_ops) {
        ops_log(p->fp_ops, "%d,%s,%d,%d\n", p->idx++, "pkt", p->pkt_offset, length);

        p->pkt_offset += length;
    }

    return MPP_OK;
}